

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

ExpEmit __thiscall FxBoolCast::Emit(FxBoolCast *this,VMFunctionBuilder *build)

{
  uint uVar1;
  uint uVar2;
  uint extraout_var;
  ulong uVar4;
  int opc;
  byte bVar5;
  ulong uVar3;
  
  uVar1 = (*this->basex->_vptr_FxExpression[9])();
  uVar3 = CONCAT44(extraout_var,uVar1);
  if ((extraout_var & 1) != 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x327,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
  }
  bVar5 = this->basex->ValueType->RegType;
  if ((1 < bVar5) && (bVar5 != 3)) {
    __assert_fail("basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x328,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
  }
  if (this->NeedValue == true) {
    uVar2 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
    bVar5 = (byte)(uVar1 >> 0x10);
    if ((extraout_var & 0x100) == 0 && bVar5 < 4) {
      VMFunctionBuilder::RegAvailability::Return
                (build->Registers + ((uint)(uVar3 >> 0x10) & 3),uVar1 & 0xffff,uVar1 >> 0x18);
    }
    opc = 0x14;
    if (bVar5 != 0) {
      opc = (bVar5 != 1) + 0x15;
    }
    VMFunctionBuilder::Emit(build,0x3f,uVar2 & 0xffff,uVar1 & 0xffff,opc);
    uVar4 = 0x1000000;
    uVar3 = (ulong)uVar2;
  }
  else {
    uVar4 = uVar3 & 0xfffffffeffff0000;
  }
  return (ExpEmit)(uVar3 & 0xffff | uVar4);
}

Assistant:

ExpEmit FxBoolCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);
	assert(basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER);

	if (NeedValue)
	{
		ExpEmit to(build, REGT_INT);
		from.Free(build);
		build->Emit(OP_CASTB, to.RegNum, from.RegNum, from.RegType == REGT_INT ? CASTB_I : from.RegType == REGT_FLOAT ? CASTB_F : CASTB_A);
		return to;
	}
	else
	{
		return from;
	}
}